

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxRandom2::FxRandom2(FxRandom2 *this,FRandom *r,FxExpression *m,FScriptPosition *pos,bool nowarn)

{
  FxIntCast *this_00;
  size_t size;
  
  size = 0x20;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Random2,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxRandom2_007065b8;
  this->EmitTail = false;
  this->rng = r;
  if (m == (FxExpression *)0x0) {
    this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,size);
    FxConstant::FxConstant((FxConstant *)this_00,-1,pos);
  }
  else {
    this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,size);
    FxIntCast::FxIntCast(this_00,m,nowarn,false);
  }
  this->mask = &this_00->super_FxExpression;
  (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
  return;
}

Assistant:

FxRandom2::FxRandom2(FRandom *r, FxExpression *m, const FScriptPosition &pos, bool nowarn)
: FxExpression(EFX_Random2, pos)
{
	EmitTail = false;
	rng = r;
	if (m) mask = new FxIntCast(m, nowarn);
	else mask = new FxConstant(-1, pos);
	ValueType = TypeSInt32;
}